

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O1

double __thiscall
Fir_Resampler_::time_ratio(Fir_Resampler_ *this,double new_factor,double rolloff,double gain)

{
  int iVar1;
  short *__s;
  double dVar2;
  sample_t_conflict1 sVar3;
  int r;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  blargg_ulong bVar8;
  sample_t_conflict1 *psVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x;
  double dVar19;
  double step;
  double pow_a_n;
  double local_f8;
  double local_a8;
  
  this->ratio_ = new_factor;
  this->res = -1;
  iVar4 = 1;
  dVar18 = 1.0;
  local_a8 = 2.0;
  local_f8 = 0.0;
  dVar17 = 0.0;
  do {
    dVar17 = dVar17 + new_factor;
    dVar10 = floor(dVar17 + 0.5);
    if (ABS(dVar17 - dVar10) < local_a8) {
      this->res = iVar4;
      local_f8 = dVar10 / dVar18;
      local_a8 = ABS(dVar17 - dVar10);
    }
    dVar18 = dVar18 + 1.0;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x21);
  this->skip_bits = 0;
  dVar17 = floor(local_f8);
  this->step = (int)dVar17 * 2;
  this->ratio_ = local_f8;
  dVar18 = fmod(local_f8,1.0);
  this->input_per_cycle = 0;
  iVar4 = this->res;
  if (0 < (long)iVar4) {
    iVar1 = this->width_;
    bVar8 = this->skip_bits;
    iVar7 = this->input_per_cycle;
    dVar2 = (double)(-(ulong)(local_f8 < 1.0) & 0x3ff0000000000000 |
                    ~-(ulong)(local_f8 < 1.0) & (ulong)(1.0 / local_f8));
    dVar11 = (double)__powidf2(rolloff,0x100);
    dVar10 = gain * dVar2 * 63.998046875;
    psVar9 = this->impulses;
    dVar12 = 0.0;
    lVar6 = 0;
    do {
      if (iVar1 != 0) {
        __x = (dVar12 + (double)(iVar1 / 2 + -1)) * dVar2 * -0.01227184630308513;
        lVar5 = 0;
        do {
          dVar19 = __x * 512.0 *
                   (1.0 / (double)(int)((int)((double)iVar1 * dVar2 + 1.0) & 0xfffffffe));
          if (3.141592653589793 <= ABS(dVar19)) {
            sVar3 = 0;
          }
          else {
            dVar13 = cos(__x);
            dVar14 = 1.0 - dVar13 * rolloff;
            dVar15 = cos(__x * 256.0);
            dVar16 = cos(__x * 255.0);
            dVar13 = (((dVar16 * dVar11 * rolloff - dVar15 * dVar11) + dVar14) * dVar10) /
                     ((rolloff * rolloff - dVar13 * rolloff) + dVar14) - dVar10;
            dVar19 = cos(dVar19);
            sVar3 = (sample_t_conflict1)(int)(dVar19 * dVar13 + dVar13);
          }
          psVar9[lVar5] = sVar3;
          __x = __x + dVar2 * 0.01227184630308513;
          lVar5 = lVar5 + 1;
        } while (iVar1 != (int)lVar5);
      }
      dVar12 = dVar12 + dVar18;
      iVar7 = iVar7 + (int)dVar17 * 2;
      if (0.9999999 <= dVar12) {
        dVar12 = dVar12 + -1.0;
        bVar8 = bVar8 | 1 << ((uint)lVar6 & 0x1f);
        this->skip_bits = bVar8;
        iVar7 = iVar7 + 1;
      }
      lVar6 = lVar6 + 1;
      psVar9 = psVar9 + iVar1;
    } while (lVar6 != iVar4);
    this->input_per_cycle = iVar7;
  }
  this->imp_phase = 0;
  if ((this->buf).size_ != 0) {
    __s = (this->buf).begin_;
    this->write_pos = __s + this->write_offset;
    memset(__s,0,(long)this->write_offset * 2);
  }
  return this->ratio_;
}

Assistant:

double Fir_Resampler_::time_ratio( double new_factor, double rolloff, double gain )
{
	ratio_ = new_factor;
	
	double fstep = 0.0;
	{
		double least_error = 2;
		double pos = 0;
		res = -1;
		for ( int r = 1; r <= max_res; r++ )
		{
			pos += ratio_;
			double nearest = floor( pos + 0.5 );
			double error = fabs( pos - nearest );
			if ( error < least_error )
			{
				res = r;
				fstep = nearest / res;
				least_error = error;
			}
		}
	}
	
	skip_bits = 0;
	
	step = stereo * (int) floor( fstep );
	
	ratio_ = fstep;
	fstep = fmod( fstep, 1.0 );
	
	double filter = (ratio_ < 1.0) ? 1.0 : 1.0 / ratio_;
	double pos = 0.0;
	input_per_cycle = 0;
	for ( int i = 0; i < res; i++ )
	{
		gen_sinc( rolloff, int (width_ * filter + 1) & ~1, pos, filter,
				double (0x7FFF * gain * filter),
				(int) width_, impulses + i * width_ );
		
		pos += fstep;
		input_per_cycle += step;
		if ( pos >= 0.9999999 )
		{
			pos -= 1.0;
			skip_bits |= 1 << i;
			input_per_cycle++;
		}
	}
	
	clear();
	
	return ratio_;
}